

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsData.cpp
# Opt level: O2

int32_t helicsDataBufferFillFromBoolean(HelicsDataBuffer data,HelicsBool value)

{
  char *pcVar1;
  SmallBuffer *store;
  int32_t iVar2;
  allocator<char> local_41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  store = getBuffer(data);
  iVar2 = 0;
  if (store != (SmallBuffer *)0x0) {
    pcVar1 = "*1";
    if (value == 0) {
      pcVar1 = "+0";
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,pcVar1 + 1,&local_41);
    helics::
    ValueConverter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::convert(&local_40,store);
    std::__cxx11::string::~string((string *)&local_40);
    iVar2 = (int32_t)store->bufferSize;
  }
  return iVar2;
}

Assistant:

int32_t helicsDataBufferFillFromBoolean(HelicsDataBuffer data, HelicsBool value)
{
    auto* ptr = getBuffer(data);
    if (ptr == nullptr) {
        return 0;
    }
    const auto* dataValue = (value == HELICS_FALSE) ? "0" : "1";
    try {
        helics::ValueConverter<std::string>::convert(dataValue, *ptr);
        return static_cast<int32_t>(ptr->size());
    }
    catch (const std::bad_alloc&) {
        return 0;
    }
}